

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::ServiceOptions::MergeFrom(ServiceOptions *this,Message *from)

{
  ServiceOptions *pSVar1;
  ServiceOptions *in_RDI;
  ServiceOptions *unaff_retaddr;
  ServiceOptions *source;
  Message *in_stack_000003c8;
  Message *in_stack_000003d0;
  
  pSVar1 = DynamicCastToGenerated<google::protobuf::ServiceOptions>(&in_RDI->super_Message);
  if (pSVar1 == (ServiceOptions *)0x0) {
    internal::ReflectionOps::Merge(in_stack_000003d0,in_stack_000003c8);
  }
  else {
    MergeFrom(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

void ServiceOptions::MergeFrom(const ::PROTOBUF_NAMESPACE_ID::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:google.protobuf.ServiceOptions)
  GOOGLE_DCHECK_NE(&from, this);
  const ServiceOptions* source =
      ::PROTOBUF_NAMESPACE_ID::DynamicCastToGenerated<ServiceOptions>(
          &from);
  if (source == nullptr) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:google.protobuf.ServiceOptions)
    ::PROTOBUF_NAMESPACE_ID::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:google.protobuf.ServiceOptions)
    MergeFrom(*source);
  }
}